

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_long_long,_char,_15>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long_long *lhs,char *rhs,char *result)

{
  char t;
  ulong uVar1;
  unsigned_long_long uVar2;
  uint32_t uVar3;
  uint64_t tmp;
  ulong uVar4;
  
  t = *rhs;
  uVar4 = (ulong)t;
  if ((long)uVar4 < 0) {
    uVar2 = *lhs;
    uVar3 = AbsValueHelper<char,_0>::Abs(t);
    uVar4 = uVar3 + uVar2;
    if ((uVar4 < *lhs) || (0x7f < uVar4)) {
LAB_00109e5a:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else {
    uVar1 = *lhs;
    if (uVar1 < uVar4) {
      uVar4 = (ulong)(byte)((char)uVar1 - t);
    }
    else {
      if (0x7f < uVar1 - uVar4) goto LAB_00109e5a;
      uVar4 = uVar1 - uVar4 & 0xffffffff;
    }
  }
  *result = (char)uVar4;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U is std::uint64_t, T is signed
        if( rhs < 0 )
        {
            // treat this as addition
            std::uint64_t tmp = 0;

            tmp = lhs + (std::uint64_t)AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( rhs );

            // must check for addition overflow and max
            if( tmp >= lhs && tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }
        else if( (std::uint64_t)rhs > lhs ) // now both are positive, so comparison always works
        {
            // result is negative
            // implies that lhs must fit into T, and result cannot overflow
            // Also allows us to drop to 32-bit math, which is faster on a 32-bit system
            result = (T)lhs - (T)rhs;
            return;
        }
        else
        {
            // result is positive
            std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }